

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O1

Str_Ntk_t * Str_ManNormalizeInt(Gia_Man_t *p,Vec_Wec_t *vGroups,Vec_Int_t *vRoots)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  uint uVar6;
  int iVar7;
  Vec_Int_t *pVVar8;
  int *piVar9;
  Str_Ntk_t *pNtk;
  Str_Obj_t *pSVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  
  if (p->pMuxes == (uint *)0x0) {
    __assert_fail("p->pMuxes != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaStr.c"
                  ,0x2dc,"Str_Ntk_t *Str_ManNormalizeInt(Gia_Man_t *, Vec_Wec_t *, Vec_Int_t *)");
  }
  if (p->vSuper == (Vec_Int_t *)0x0) {
    pVVar8 = (Vec_Int_t *)malloc(0x10);
    pVVar8->nCap = 100;
    pVVar8->nSize = 0;
    piVar9 = (int *)malloc(400);
    pVVar8->pArray = piVar9;
    p->vSuper = pVVar8;
  }
  if (p->vStore == (Vec_Int_t *)0x0) {
    pVVar8 = (Vec_Int_t *)malloc(0x10);
    pVVar8->nCap = 100;
    pVVar8->nSize = 0;
    piVar9 = (int *)malloc(400);
    pVVar8->pArray = piVar9;
    p->vStore = pVVar8;
  }
  Gia_ManFillValue(p);
  iVar7 = p->nObjs;
  iVar1 = p->vCos->nSize;
  iVar2 = p->nMuxes;
  iVar3 = p->vCis->nSize;
  pNtk = (Str_Ntk_t *)calloc(1,0x50);
  pSVar10 = (Str_Obj_t *)malloc((long)iVar7 << 4);
  pNtk->pObjs = pSVar10;
  pNtk->nObjsAlloc = iVar7;
  iVar4 = pNtk->nObjs;
  if (iVar4 < iVar7) {
    *(undefined4 *)(pSVar10 + iVar4) = 1;
    pSVar10[iVar4].iOffset = (pNtk->vFanins).nSize;
    pNtk->nObjCount[1] = pNtk->nObjCount[1] + 1;
    pSVar10[iVar4].iTop = -1;
    pSVar10[iVar4].iCopy = -1;
    pNtk->nObjs = iVar4 + 1;
    if (iVar4 < 0) {
LAB_0076b5e6:
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                    ,0xf1,"int Abc_Var2Lit(int, int)");
    }
    iVar7 = iVar2 + iVar1 + 1 + (~(iVar1 + iVar3) + iVar7) * 2;
    if ((pNtk->vFanins).nCap < iVar7) {
      piVar9 = (pNtk->vFanins).pArray;
      if (piVar9 == (int *)0x0) {
        piVar9 = (int *)malloc((long)iVar7 << 2);
      }
      else {
        piVar9 = (int *)realloc(piVar9,(long)iVar7 << 2);
      }
      (pNtk->vFanins).pArray = piVar9;
      if (piVar9 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vFanins).nCap = iVar7;
    }
    p->pObjs->Value = 0;
    iVar7 = p->nObjs;
    if (1 < iVar7) {
      lVar13 = 1;
      lVar12 = 0xc;
      do {
        pGVar5 = p->pObjs;
        uVar6 = (uint)*(ulong *)(&pGVar5->field_0x0 + lVar12);
        if ((~uVar6 & 0x9fffffff) == 0) {
          iVar7 = pNtk->nObjs;
          if (pNtk->nObjsAlloc <= iVar7) goto LAB_0076b5c7;
          pSVar10 = pNtk->pObjs;
          *(undefined4 *)(pSVar10 + iVar7) = 2;
          pSVar10[iVar7].iOffset = (pNtk->vFanins).nSize;
          pSVar10[iVar7].iTop = -1;
          pSVar10[iVar7].iCopy = -1;
          pNtk->nObjCount[2] = pNtk->nObjCount[2] + 1;
          iVar7 = pNtk->nObjs;
          pNtk->nObjs = iVar7 + 1;
          if (iVar7 < 0) goto LAB_0076b5e6;
LAB_0076b590:
          *(int *)((long)&pGVar5->Value + lVar12) = iVar7 * 2;
        }
        else {
          uVar11 = *(ulong *)(&pGVar5->field_0x0 + lVar12) & 0x1fffffff;
          if (uVar11 != 0x1fffffff && (int)uVar6 < 0) {
            Str_ManNormalize_rec
                      (pNtk,p,(Gia_Obj_t *)
                              ((long)pGVar5 + (ulong)(uint)((int)uVar11 << 2) * -3 + lVar12),vGroups
                       ,vRoots);
            uVar14 = (uint)*(undefined8 *)(&pGVar5->field_0x0 + lVar12);
            uVar6 = *(uint *)((long)pGVar5 + (ulong)((uVar14 & 0x1fffffff) << 2) * -3 + lVar12 + 8);
            if ((int)uVar6 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                            ,0xf5,"int Abc_LitNotCond(int, int)");
            }
            iVar7 = pNtk->nObjs;
            if (iVar7 < pNtk->nObjsAlloc) {
              pSVar10 = pNtk->pObjs;
              *(undefined4 *)(pSVar10 + iVar7) = 0x17;
              pSVar10[iVar7].iOffset = (pNtk->vFanins).nSize;
              pSVar10[iVar7].iTop = -1;
              pSVar10[iVar7].iCopy = -1;
              Vec_IntPush(&pNtk->vFanins,uVar14 >> 0x1d & 1 ^ uVar6);
              pNtk->nObjCount[7] = pNtk->nObjCount[7] + 1;
              iVar7 = pNtk->nObjs;
              pNtk->nObjs = iVar7 + 1;
              if (-1 < iVar7) goto LAB_0076b590;
              goto LAB_0076b5e6;
            }
            goto LAB_0076b5c7;
          }
        }
        lVar13 = lVar13 + 1;
        iVar7 = p->nObjs;
        lVar12 = lVar12 + 0xc;
      } while (lVar13 < iVar7);
    }
    if (iVar7 < pNtk->nObjs) {
      __assert_fail("pNtk->nObjs <= Gia_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaStr.c"
                    ,0x2ef,"Str_Ntk_t *Str_ManNormalizeInt(Gia_Man_t *, Vec_Wec_t *, Vec_Int_t *)");
    }
    return pNtk;
  }
LAB_0076b5c7:
  __assert_fail("p->nObjs < p->nObjsAlloc",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaStr.c"
                ,0x6f,"int Str_ObjCreate(Str_Ntk_t *, int, int, int *)");
}

Assistant:

Str_Ntk_t * Str_ManNormalizeInt( Gia_Man_t * p, Vec_Wec_t * vGroups, Vec_Int_t * vRoots )
{
    Str_Ntk_t * pNtk;
    Gia_Obj_t * pObj;
    int i, iFanin;
    assert( p->pMuxes != NULL );
    if ( p->vSuper == NULL )
        p->vSuper = Vec_IntAlloc( STR_SUPER );
    if ( p->vStore == NULL )
        p->vStore = Vec_IntAlloc( STR_SUPER );
    Gia_ManFillValue( p );
    pNtk = Str_NtkCreate( Gia_ManObjNum(p), 1 + Gia_ManCoNum(p) + 2 * Gia_ManAndNum(p) + Gia_ManMuxNum(p) );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Str_ObjCreate( pNtk, STR_PI, 0, NULL );
        else if ( Gia_ObjIsCo(pObj) )
        {
            Str_ManNormalize_rec( pNtk, p, Gia_ObjFanin0(pObj), vGroups, vRoots );
            iFanin = Gia_ObjFanin0Copy(pObj);
            pObj->Value = Str_ObjCreate( pNtk, STR_PO, 1, &iFanin );
        }
    }
    assert( pNtk->nObjs <= Gia_ManObjNum(p) );
    return pNtk;
}